

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseQuotedText(WastParser *this,string *text,bool check_utf8)

{
  bool bVar1;
  char cVar2;
  TokenType TVar3;
  Result RVar4;
  undefined7 in_register_00000011;
  uint uVar5;
  value_type *pvVar6;
  char cVar7;
  char *__assertion;
  value_type *__value;
  uint32_t hi;
  undefined4 local_98;
  uint32_t lo;
  WastParser *local_90;
  string_view local_88;
  undefined8 local_78;
  Token token;
  
  TVar3 = Peek(this,0);
  if (TVar3 == Text) {
    local_98 = (undefined4)CONCAT71(in_register_00000011,check_utf8);
    local_90 = this;
    Consume(&token,this);
    local_88 = Token::text(&token);
    if (2 < local_88._M_len) {
      local_88 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           (&local_88,1,local_88._M_len - 2);
      __value = local_88._M_str;
      pvVar6 = __value + local_88._M_len;
      for (; __value < pvVar6; __value = __value + 1) {
        if (*__value != '\\') {
          _hi = text;
          std::
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator=((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&hi,__value);
          goto LAB_0013329b;
        }
        cVar2 = __value[1];
        cVar7 = (char)text;
        switch(cVar2) {
        case 'n':
          break;
        case 'o':
        case 'p':
        case 'q':
        case 's':
switchD_00133196_caseD_6f:
          RVar4 = ParseHexdigit(cVar2,&hi);
          if ((RVar4.enum_ != Ok) || (RVar4 = ParseHexdigit(__value[2],&lo), RVar4.enum_ != Ok)) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                          ,0x83,
                          "void wabt::(anonymous namespace)::RemoveEscapes(std::string_view, OutputIter) [OutputIter = std::back_insert_iterator<std::basic_string<char>>]"
                         );
          }
          __value = __value + 2;
          std::__cxx11::string::push_back(cVar7);
          goto LAB_0013329b;
        case 'r':
          break;
        case 't':
          break;
        case 'u':
          cVar2 = __value[3];
          __value = __value + 3;
          uVar5 = 0;
          do {
            RVar4 = ParseHexdigit(cVar2,&hi);
            if (RVar4.enum_ != Ok) {
              __assertion = "0";
              uVar5 = 0x5b;
              goto LAB_0013331e;
            }
            uVar5 = uVar5 << 4 | hi;
            cVar2 = __value[1];
            __value = __value + 1;
          } while (cVar2 != '}');
          if (0x10ffff < uVar5) {
            __assertion = "scalar_value < 0x110000";
            uVar5 = 0x61;
LAB_0013331e:
            __assert_fail(__assertion,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                          ,uVar5,
                          "void wabt::(anonymous namespace)::RemoveEscapes(std::string_view, OutputIter) [OutputIter = std::back_insert_iterator<std::basic_string<char>>]"
                         );
          }
          if (0x7f < uVar5) {
            if (0x7ff < uVar5) {
              if (0xffff < uVar5) {
                std::__cxx11::string::push_back(cVar7);
              }
              std::__cxx11::string::push_back(cVar7);
            }
            std::__cxx11::string::push_back(cVar7);
          }
          std::__cxx11::string::push_back(cVar7);
          goto LAB_0013329b;
        default:
          if (((cVar2 != '\"') && (cVar2 != '\'')) && (cVar2 != '\\'))
          goto switchD_00133196_caseD_6f;
        }
        std::__cxx11::string::push_back(cVar7);
        __value = __value + 1;
LAB_0013329b:
      }
    }
    if (((char)local_98 != '\0') &&
       (bVar1 = IsValidUtf8((text->_M_dataplus)._M_p,text->_M_string_length), !bVar1)) {
      Error(local_90,0x18d311);
    }
    RVar4.enum_ = Ok;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&token,"a quoted string",(allocator<char> *)&hi);
    local_88 = (string_view)ZEXT816(0);
    local_78 = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,&token
               ,&token.token_type_);
    RVar4 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_88,"\"foo\"");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_88);
    std::__cxx11::string::_M_dispose();
  }
  return (Result)RVar4.enum_;
}

Assistant:

Result WastParser::ParseQuotedText(std::string* text, bool check_utf8) {
  WABT_TRACE(ParseQuotedText);
  if (!PeekMatch(TokenType::Text)) {
    return ErrorExpected({"a quoted string"}, "\"foo\"");
  }

  Token token = Consume();
  RemoveEscapes(token.text(), std::back_inserter(*text));
  if (check_utf8 && !IsValidUtf8(text->data(), text->length())) {
    Error(token.loc, "quoted string has an invalid utf-8 encoding");
  }
  return Result::Ok;
}